

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cpp
# Opt level: O0

optional<Token> * __thiscall
Tokenizer::NextToken(optional<Token> *__return_storage_ptr__,Tokenizer *this)

{
  bool bVar1;
  ulong uVar2;
  Error *this_00;
  allocator<char> local_39;
  string local_38;
  Tokenizer *local_18;
  Tokenizer *this_local;
  
  local_18 = this;
  this_local = (Tokenizer *)__return_storage_ptr__;
  if ((this->_initialized & 1U) == 0) {
    readAll(this);
  }
  uVar2 = std::ios::bad();
  if ((uVar2 & 1) == 0) {
    bVar1 = isEOF(this);
    if (bVar1) {
      std::optional<Token>::optional(__return_storage_ptr__);
    }
    else {
      nextToken(__return_storage_ptr__,this);
    }
    return __return_storage_ptr__;
  }
  this_00 = (Error *)__cxa_allocate_exception(0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"StreamError",&local_39);
  Error::Error(this_00,&local_38);
  __cxa_throw(this_00,&Error::typeinfo,Error::~Error);
}

Assistant:

std::optional<Token> Tokenizer::NextToken() {
	if (!_initialized)
		readAll();
	if (_rdr.bad()) {
		throw Error("StreamError");
	}
	if (isEOF()) {
		return {};
	}
	return nextToken();
}